

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::InterpretArgument
          (CommandLineInterface *this,string *name,string *value)

{
  bool bVar1;
  byte bVar2;
  undefined1 uVar3;
  int iVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  char *pcVar8;
  mapped_type *pmVar9;
  ostream *poVar10;
  undefined4 uVar11;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_type colon_pos;
  OutputDirective directive;
  string *parameters_1;
  string *parameters;
  GeneratorInfo *generator_info;
  size_type slash_pos;
  size_type equals_pos_1;
  string path;
  string plugin_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  direct;
  size_type equals_pos;
  string disk_path;
  string virtual_path;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  value_type *in_stack_fffffffffffffb38;
  string *psVar12;
  undefined7 in_stack_fffffffffffffb40;
  undefined1 in_stack_fffffffffffffb47;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffb48;
  value_type *__x;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffb50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffb60;
  undefined6 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6e;
  undefined1 in_stack_fffffffffffffb6f;
  key_type *in_stack_fffffffffffffb78;
  undefined6 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb86;
  undefined1 uVar13;
  undefined1 in_stack_fffffffffffffb87;
  string *in_stack_fffffffffffffba0;
  string *in_stack_fffffffffffffba8;
  byte local_44a;
  byte local_449;
  CommandLineInterface *in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbf8;
  string local_3d0 [32];
  string local_3b0 [32];
  long local_390;
  value_type local_388;
  string local_320 [32];
  mapped_type *local_300;
  byte local_2f3;
  byte local_2f2;
  undefined1 local_2f1 [40];
  allocator local_2c9;
  string local_2c8 [32];
  mapped_type *local_2a8;
  byte local_29b;
  byte local_29a;
  undefined1 local_299 [33];
  second_type *local_278;
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  long local_210;
  long local_208;
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  int local_dc;
  string local_d8 [32];
  string local_b8 [48];
  long local_88;
  string local_80 [32];
  string local_60 [36];
  int local_3c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  string *local_20;
  string *local_18;
  ParseArgumentStatus local_4;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                            (char *)in_stack_fffffffffffffb38);
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                                (char *)in_stack_fffffffffffffb38), bVar1)) {
      Split((string *)
            CONCAT17(in_stack_fffffffffffffb6f,
                     CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)),
            (char *)in_stack_fffffffffffffb60,SUB81((ulong)in_stack_fffffffffffffb58 >> 0x38,0));
      for (local_3c = 0; uVar5 = (ulong)local_3c,
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&local_38), uVar5 < sVar6; local_3c = local_3c + 1) {
        std::__cxx11::string::string(local_60);
        std::__cxx11::string::string(local_80);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_38,(long)local_3c);
        local_88 = std::__cxx11::string::find_first_of((char)pvVar7,0x3d);
        if (local_88 == -1) {
          std::__cxx11::string::operator=(local_60,"");
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&local_38,(long)local_3c);
          std::__cxx11::string::operator=(local_80,(string *)pvVar7);
        }
        else {
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&local_38,(long)local_3c);
          std::__cxx11::string::substr((ulong)local_b8,(ulong)pvVar7);
          std::__cxx11::string::operator=(local_60,local_b8);
          std::__cxx11::string::~string(local_b8);
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&local_38,(long)local_3c);
          std::__cxx11::string::substr((ulong)local_d8,(ulong)pvVar7);
          std::__cxx11::string::operator=(local_80,local_d8);
          std::__cxx11::string::~string(local_d8);
        }
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          pcVar8 = (char *)std::__cxx11::string::c_str();
          iVar4 = access(pcVar8,0);
          if (iVar4 < 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_38,(long)local_3c);
            pcVar8 = (char *)std::__cxx11::string::c_str();
            iVar4 = access(pcVar8,0);
            if (iVar4 < 0) {
              poVar10 = std::operator<<((ostream *)&std::cerr,local_80);
              poVar10 = std::operator<<(poVar10,": warning: directory does not exist.");
              std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
            }
            else {
              std::__cxx11::string::operator=(local_60,"");
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](&local_38,(long)local_3c);
              std::__cxx11::string::operator=(local_80,(string *)pvVar7);
            }
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                     in_stack_fffffffffffffb50._M_current);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                      in_stack_fffffffffffffb38);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40));
          local_dc = 0;
        }
        else {
          poVar10 = std::operator<<((ostream *)&std::cerr,
                                    "--proto_path passed empty directory name.  (Use \".\" for current directory.)"
                                   );
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          local_4 = PARSE_ARGUMENT_FAIL;
          local_dc = 1;
        }
        std::__cxx11::string::~string(local_80);
        std::__cxx11::string::~string(local_60);
        if (local_dc != 0) goto LAB_0041809f;
      }
      local_dc = 0;
LAB_0041809f:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb50._M_current);
      if (local_dc != 0) {
        return local_4;
      }
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                              (char *)in_stack_fffffffffffffb38);
      if (bVar1) {
        if (((byte)in_RDI[0x1c0] & 1) != 0) {
          poVar10 = std::operator<<((ostream *)&std::cerr,(string *)local_18);
          poVar10 = std::operator<<(poVar10,
                                    " may only be passed once. To specify multiple direct dependencies, pass them all as a single parameter separated by \':\'."
                                   );
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          return PARSE_ARGUMENT_FAIL;
        }
        in_RDI[0x1c0] = (string)0x1;
        Split((string *)
              CONCAT17(in_stack_fffffffffffffb6f,
                       CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)),
              (char *)in_stack_fffffffffffffb60,SUB81((ulong)in_stack_fffffffffffffb58 >> 0x38,0));
        local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffffb38);
        local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffb38);
        std::
        set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                   in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffb50._M_current);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                                (char *)in_stack_fffffffffffffb38);
        if (bVar1) {
          std::__cxx11::string::operator=(in_RDI + 0x1c8,(string *)local_20);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                                  (char *)in_stack_fffffffffffffb38);
          if (bVar1) {
            bVar1 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffffb50._M_current);
            uVar3 = (undefined1)((ulong)in_stack_fffffffffffffb58 >> 0x38);
            if (!bVar1) {
              poVar10 = std::operator<<((ostream *)&std::cerr,(string *)local_18);
              poVar10 = std::operator<<(poVar10,
                                        " may only be passed once. To specify multiple descriptor sets, pass them all as a single parameter separated by \'"
                                       );
              poVar10 = std::operator<<(poVar10,":");
              poVar10 = std::operator<<(poVar10,"\'.");
              std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
              return PARSE_ARGUMENT_FAIL;
            }
            uVar5 = std::__cxx11::string::empty();
            if ((uVar5 & 1) != 0) {
              poVar10 = std::operator<<((ostream *)&std::cerr,(string *)local_18);
              poVar10 = std::operator<<(poVar10," requires a non-empty value.");
              std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
              return PARSE_ARGUMENT_FAIL;
            }
            uVar5 = std::__cxx11::string::empty();
            if ((uVar5 & 1) == 0) {
              poVar10 = std::operator<<((ostream *)&std::cerr,(string *)local_18);
              poVar10 = std::operator<<(poVar10," cannot be used with --dependency_out.");
              std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
              return PARSE_ARGUMENT_FAIL;
            }
            Split((string *)
                  CONCAT17(in_stack_fffffffffffffb6f,
                           CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)),
                  (char *)in_stack_fffffffffffffb60,(bool)uVar3);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffb50._M_current,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffb48._M_current);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffb50._M_current);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40)
                                    ,(char *)in_stack_fffffffffffffb38);
            if ((bVar1) ||
               (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(in_stack_fffffffffffffb47,
                                                    in_stack_fffffffffffffb40),
                                        (char *)in_stack_fffffffffffffb38), bVar1)) {
              uVar5 = std::__cxx11::string::empty();
              if ((uVar5 & 1) == 0) {
                poVar10 = std::operator<<((ostream *)&std::cerr,(string *)local_18);
                poVar10 = std::operator<<(poVar10," may only be passed once.");
                std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                return PARSE_ARGUMENT_FAIL;
              }
              uVar5 = std::__cxx11::string::empty();
              if ((uVar5 & 1) != 0) {
                poVar10 = std::operator<<((ostream *)&std::cerr,(string *)local_18);
                poVar10 = std::operator<<(poVar10," requires a non-empty value.");
                std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                return PARSE_ARGUMENT_FAIL;
              }
              if (*(int *)(in_RDI + 0x150) != 0) {
                poVar10 = std::operator<<((ostream *)&std::cerr,
                                          "Cannot use --encode or --decode and generate descriptors at the same time."
                                         );
                std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                return PARSE_ARGUMENT_FAIL;
              }
              std::__cxx11::string::operator=(in_RDI + 0x238,(string *)local_20);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffffb47,
                                                  in_stack_fffffffffffffb40),
                                      (char *)in_stack_fffffffffffffb38);
              if (bVar1) {
                uVar5 = std::__cxx11::string::empty();
                if ((uVar5 & 1) == 0) {
                  poVar10 = std::operator<<((ostream *)&std::cerr,(string *)local_18);
                  poVar10 = std::operator<<(poVar10," may only be passed once.");
                  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                  return PARSE_ARGUMENT_FAIL;
                }
                uVar5 = std::__cxx11::string::empty();
                if ((uVar5 & 1) != 0) {
                  poVar10 = std::operator<<((ostream *)&std::cerr,(string *)local_18);
                  poVar10 = std::operator<<(poVar10," requires a non-empty value.");
                  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                  return PARSE_ARGUMENT_FAIL;
                }
                bVar1 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffffb50._M_current);
                if (!bVar1) {
                  poVar10 = std::operator<<((ostream *)&std::cerr,(string *)local_18);
                  poVar10 = std::operator<<(poVar10," cannot be used with --descriptor_set_in.");
                  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                  return PARSE_ARGUMENT_FAIL;
                }
                std::__cxx11::string::operator=(in_RDI + 600,(string *)local_20);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(in_stack_fffffffffffffb47,
                                                    in_stack_fffffffffffffb40),
                                        (char *)in_stack_fffffffffffffb38);
                if (bVar1) {
                  if (((byte)in_RDI[0x278] & 1) != 0) {
                    poVar10 = std::operator<<((ostream *)&std::cerr,(string *)local_18);
                    poVar10 = std::operator<<(poVar10," may only be passed once.");
                    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                    return PARSE_ARGUMENT_FAIL;
                  }
                  in_RDI[0x278] = (string)0x1;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(in_stack_fffffffffffffb47,
                                                      in_stack_fffffffffffffb40),
                                          (char *)in_stack_fffffffffffffb38);
                  if (bVar1) {
                    if (((byte)in_RDI[0x279] & 1) != 0) {
                      poVar10 = std::operator<<((ostream *)&std::cerr,(string *)local_18);
                      poVar10 = std::operator<<(poVar10," may only be passed once.");
                      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                      return PARSE_ARGUMENT_FAIL;
                    }
                    in_RDI[0x279] = (string)0x1;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT17(in_stack_fffffffffffffb47,
                                                        in_stack_fffffffffffffb40),
                                            (char *)in_stack_fffffffffffffb38);
                    if ((bVar1) ||
                       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)CONCAT17(in_stack_fffffffffffffb47,
                                                            in_stack_fffffffffffffb40),
                                                (char *)in_stack_fffffffffffffb38), bVar1)) {
                      PrintHelpText(in_stack_fffffffffffffbc0);
                      return PARSE_ARGUMENT_DONE_AND_EXIT;
                    }
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT17(in_stack_fffffffffffffb47,
                                                        in_stack_fffffffffffffb40),
                                            (char *)in_stack_fffffffffffffb38);
                    if (bVar1) {
                      uVar5 = std::__cxx11::string::empty();
                      if ((uVar5 & 1) == 0) {
                        poVar10 = std::operator<<((ostream *)&std::cout,in_RDI + 0x20);
                        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                      }
                      poVar10 = std::operator<<((ostream *)&std::cout,"libprotoc ");
                      internal::VersionString_abi_cxx11_(iVar4);
                      poVar10 = std::operator<<(poVar10,local_1c0);
                      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                      std::__cxx11::string::~string(local_1c0);
                      return PARSE_ARGUMENT_DONE_AND_EXIT;
                    }
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT17(in_stack_fffffffffffffb47,
                                                        in_stack_fffffffffffffb40),
                                            (char *)in_stack_fffffffffffffb38);
                    if (bVar1) {
                      in_RDI[0x27a] = (string)0x1;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)CONCAT17(in_stack_fffffffffffffb47,
                                                          in_stack_fffffffffffffb40),
                                              (char *)in_stack_fffffffffffffb38);
                      if (((bVar1) ||
                          (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffb47,
                                                             in_stack_fffffffffffffb40),
                                                  (char *)in_stack_fffffffffffffb38), bVar1)) ||
                         (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffb47,
                                                             in_stack_fffffffffffffb40),
                                                  (char *)in_stack_fffffffffffffb38), bVar1)) {
                        if (*(int *)(in_RDI + 0x150) != 0) {
                          poVar10 = std::operator<<((ostream *)&std::cerr,
                                                                                                        
                                                  "Only one of --encode and --decode can be specified."
                                                  );
                          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                          return PARSE_ARGUMENT_FAIL;
                        }
                        bVar1 = std::
                                vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                                ::empty((vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                                         *)in_stack_fffffffffffffb50._M_current);
                        if ((!bVar1) || (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
                          poVar10 = std::operator<<((ostream *)&std::cerr,"Cannot use ");
                          poVar10 = std::operator<<(poVar10,(string *)local_18);
                          poVar10 = std::operator<<(poVar10,
                                                  " and generate code or descriptors at the same time."
                                                  );
                          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                          return PARSE_ARGUMENT_FAIL;
                        }
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)CONCAT17(in_stack_fffffffffffffb47,
                                                            in_stack_fffffffffffffb40),
                                                (char *)in_stack_fffffffffffffb38);
                        uVar11 = 2;
                        if (bVar1) {
                          uVar11 = 1;
                        }
                        *(undefined4 *)(in_RDI + 0x150) = uVar11;
                        uVar5 = std::__cxx11::string::empty();
                        if (((uVar5 & 1) != 0) &&
                           (bVar1 = std::operator!=((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffb47,
                                                             in_stack_fffffffffffffb40),
                                                  (char *)in_stack_fffffffffffffb38), bVar1)) {
                          poVar10 = std::operator<<((ostream *)&std::cerr,"Type name for ");
                          poVar10 = std::operator<<(poVar10,(string *)local_18);
                          poVar10 = std::operator<<(poVar10," cannot be blank.");
                          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffb47,
                                                             in_stack_fffffffffffffb40),
                                                  (char *)in_stack_fffffffffffffb38);
                          if (bVar1) {
                            poVar10 = std::operator<<((ostream *)&std::cerr,
                                                                                                            
                                                  "To decode an unknown message, use --decode_raw.")
                            ;
                            std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>)
                            ;
                          }
                          return PARSE_ARGUMENT_FAIL;
                        }
                        uVar5 = std::__cxx11::string::empty();
                        if (((uVar5 & 1) == 0) &&
                           (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffb47,
                                                             in_stack_fffffffffffffb40),
                                                  (char *)in_stack_fffffffffffffb38), bVar1)) {
                          poVar10 = std::operator<<((ostream *)&std::cerr,
                                                    "--decode_raw does not take a parameter.");
                          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                          return PARSE_ARGUMENT_FAIL;
                        }
                        std::__cxx11::string::operator=(in_RDI + 0x200,(string *)local_20);
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)CONCAT17(in_stack_fffffffffffffb47,
                                                            in_stack_fffffffffffffb40),
                                                (char *)in_stack_fffffffffffffb38);
                        if (bVar1) {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffb47,
                                                             in_stack_fffffffffffffb40),
                                                  (char *)in_stack_fffffffffffffb38);
                          if (bVar1) {
                            *(undefined4 *)(in_RDI + 0x158) = 0;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffb47,
                                                             in_stack_fffffffffffffb40),
                                                  (char *)in_stack_fffffffffffffb38);
                            if (!bVar1) {
                              poVar10 = std::operator<<((ostream *)&std::cerr,
                                                        "Unknown error format: ");
                              poVar10 = std::operator<<(poVar10,(string *)local_20);
                              std::ostream::operator<<
                                        (poVar10,std::endl<char,std::char_traits<char>>);
                              return PARSE_ARGUMENT_FAIL;
                            }
                            *(undefined4 *)(in_RDI + 0x158) = 1;
                          }
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffb47,
                                                             in_stack_fffffffffffffb40),
                                                  (char *)in_stack_fffffffffffffb38);
                          if (bVar1) {
                            uVar5 = std::__cxx11::string::empty();
                            if ((uVar5 & 1) != 0) {
                              poVar10 = std::operator<<((ostream *)&std::cerr,
                                                        "This compiler does not support plugins.");
                              std::ostream::operator<<
                                        (poVar10,std::endl<char,std::char_traits<char>>);
                              return PARSE_ARGUMENT_FAIL;
                            }
                            std::__cxx11::string::string(local_1e0);
                            std::__cxx11::string::string(local_200);
                            local_208 = std::__cxx11::string::find_first_of((char)local_20,0x3d);
                            if (local_208 == -1) {
                              local_210 = std::__cxx11::string::find_last_of((char)local_20,0x2f);
                              if (local_210 == -1) {
                                std::__cxx11::string::operator=(local_1e0,(string *)local_20);
                              }
                              else {
                                std::__cxx11::string::substr((ulong)local_230,(ulong)local_20);
                                std::__cxx11::string::operator=(local_1e0,local_230);
                                std::__cxx11::string::~string(local_230);
                              }
                              std::__cxx11::string::operator=(local_200,(string *)local_20);
                            }
                            else {
                              std::__cxx11::string::substr((ulong)local_250,(ulong)local_20);
                              psVar12 = local_250;
                              std::__cxx11::string::operator=(local_1e0,psVar12);
                              std::__cxx11::string::~string(psVar12);
                              std::__cxx11::string::substr((ulong)local_270,(ulong)local_20);
                              std::__cxx11::string::operator=(local_200,local_270);
                              std::__cxx11::string::~string(local_270);
                            }
                            pmVar9 = std::
                                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffffb87,
                                                             CONCAT16(in_stack_fffffffffffffb86,
                                                                      in_stack_fffffffffffffb80)),
                                                  in_stack_fffffffffffffb78);
                            std::__cxx11::string::operator=((string *)pmVar9,local_200);
                            std::__cxx11::string::~string(local_200);
                            std::__cxx11::string::~string(local_1e0);
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffb47,
                                                             in_stack_fffffffffffffb40),
                                                  (char *)in_stack_fffffffffffffb38);
                            if (bVar1) {
                              if (*(int *)(in_RDI + 0x150) != 0) {
                                poVar10 = std::operator<<((ostream *)&std::cerr,"Cannot use ");
                                poVar10 = std::operator<<(poVar10,(string *)local_18);
                                poVar10 = std::operator<<(poVar10,
                                                  " and use --encode, --decode or print ");
                                poVar10 = std::operator<<(poVar10,"other info at the same time.");
                                std::ostream::operator<<
                                          (poVar10,std::endl<char,std::char_traits<char>>);
                                return PARSE_ARGUMENT_FAIL;
                              }
                              bVar1 = std::
                                      vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                                      ::empty((vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                                               *)in_stack_fffffffffffffb50._M_current);
                              if ((!bVar1) ||
                                 (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
                                poVar10 = std::operator<<((ostream *)&std::cerr,"Cannot use ");
                                poVar10 = std::operator<<(poVar10,(string *)local_18);
                                poVar10 = std::operator<<(poVar10,
                                                  " and generate code or descriptors at the same time."
                                                  );
                                std::ostream::operator<<
                                          (poVar10,std::endl<char,std::char_traits<char>>);
                                return PARSE_ARGUMENT_FAIL;
                              }
                              *(undefined4 *)(in_RDI + 0x150) = 3;
                              *(undefined4 *)(in_RDI + 0x154) = 1;
                            }
                            else {
                              local_278 = FindOrNull<std::map<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>>
                                                    ((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>_>
                                                  *)in_stack_fffffffffffffb48._M_current,
                                                  (first_type *)
                                                  CONCAT17(in_stack_fffffffffffffb47,
                                                           in_stack_fffffffffffffb40));
                              local_29a = 0;
                              local_29b = 0;
                              local_449 = 0;
                              if (local_278 == (second_type *)0x0) {
                                bVar2 = std::__cxx11::string::empty();
                                local_44a = 1;
                                if ((bVar2 & 1) == 0) {
                                  in_stack_fffffffffffffba8 = (string *)local_299;
                                  in_stack_fffffffffffffba0 = local_18;
                                  std::allocator<char>::allocator();
                                  local_29a = 1;
                                  std::__cxx11::string::string
                                            ((string *)(local_299 + 1),"_out",
                                             (allocator *)in_stack_fffffffffffffba8);
                                  local_29b = 1;
                                  bVar1 = HasSuffixString(&in_stack_fffffffffffffb60->first,
                                                          in_stack_fffffffffffffb58);
                                  local_44a = bVar1 ^ 0xff;
                                }
                                local_449 = local_44a;
                              }
                              if ((local_29b & 1) != 0) {
                                std::__cxx11::string::~string((string *)(local_299 + 1));
                              }
                              if ((local_29a & 1) != 0) {
                                std::allocator<char>::~allocator((allocator<char> *)local_299);
                              }
                              if ((local_449 & 1) == 0) {
                                if (*(int *)(in_RDI + 0x150) != 0) {
                                  poVar10 = std::operator<<((ostream *)&std::cerr,
                                                                                                                        
                                                  "Cannot use --encode, --decode or print .proto info and generate code at the same time."
                                                  );
                                  std::ostream::operator<<
                                            (poVar10,std::endl<char,std::char_traits<char>>);
                                  return PARSE_ARGUMENT_FAIL;
                                }
                                __x = &local_388;
                                OutputDirective::OutputDirective
                                          ((OutputDirective *)
                                           CONCAT17(in_stack_fffffffffffffb47,
                                                    in_stack_fffffffffffffb40));
                                std::__cxx11::string::operator=((string *)__x,(string *)local_18);
                                if (local_278 == (second_type *)0x0) {
                                  local_388.generator = (CodeGenerator *)0x0;
                                }
                                else {
                                  local_388.generator = local_278->generator;
                                }
                                local_390 = std::__cxx11::string::find_first_of((char)local_20,0x3a)
                                ;
                                if ((local_390 == -1) ||
                                   (in_stack_fffffffffffffb47 =
                                         anon_unknown_4::IsWindowsAbsolutePath(local_20),
                                   (bool)in_stack_fffffffffffffb47)) {
                                  std::__cxx11::string::operator=
                                            ((string *)&local_388.output_location,(string *)local_20
                                            );
                                }
                                else {
                                  std::__cxx11::string::substr((ulong)local_3b0,(ulong)local_20);
                                  psVar12 = local_3b0;
                                  std::__cxx11::string::operator=
                                            ((string *)&local_388.parameter,psVar12);
                                  std::__cxx11::string::~string(psVar12);
                                  std::__cxx11::string::substr((ulong)local_3d0,(ulong)local_20);
                                  std::__cxx11::string::operator=
                                            ((string *)&local_388.output_location,local_3d0);
                                  std::__cxx11::string::~string(local_3d0);
                                }
                                std::
                                vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                                ::push_back((vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                                             *)in_stack_fffffffffffffb50._M_current,__x);
                                OutputDirective::~OutputDirective
                                          ((OutputDirective *)
                                           CONCAT17(in_stack_fffffffffffffb47,
                                                    in_stack_fffffffffffffb40));
                              }
                              else {
                                local_278 = FindOrNull<std::map<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>>
                                                      ((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>_>
                                                  *)in_stack_fffffffffffffb48._M_current,
                                                  (first_type *)
                                                  CONCAT17(in_stack_fffffffffffffb47,
                                                           in_stack_fffffffffffffb40));
                                if (local_278 == (second_type *)0x0) {
                                  std::allocator<char>::allocator();
                                  local_2f2 = 0;
                                  local_2f3 = 0;
                                  std::__cxx11::string::string(local_2c8,"--",&local_2c9);
                                  uVar3 = HasPrefixString(in_stack_fffffffffffffb50._M_current,
                                                          in_stack_fffffffffffffb48._M_current);
                                  bVar2 = false;
                                  if ((bool)uVar3) {
                                    in_stack_fffffffffffffb78 = (key_type *)local_2f1;
                                    std::allocator<char>::allocator();
                                    local_2f2 = 1;
                                    std::__cxx11::string::string
                                              ((string *)(local_2f1 + 1),"_opt",
                                               (allocator *)in_stack_fffffffffffffb78);
                                    local_2f3 = 1;
                                    bVar2 = HasSuffixString(&in_stack_fffffffffffffb60->first,
                                                            in_stack_fffffffffffffb58);
                                  }
                                  uVar13 = bVar2;
                                  if ((local_2f3 & 1) != 0) {
                                    std::__cxx11::string::~string((string *)(local_2f1 + 1));
                                  }
                                  if ((local_2f2 & 1) != 0) {
                                    std::allocator<char>::~allocator((allocator<char> *)local_2f1);
                                  }
                                  std::__cxx11::string::~string(local_2c8);
                                  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
                                  if ((bVar2 & 1) == 0) {
                                    poVar10 = std::operator<<((ostream *)&std::cerr,"Unknown flag: "
                                                             );
                                    poVar10 = std::operator<<(poVar10,(string *)local_18);
                                    std::ostream::operator<<
                                              (poVar10,std::endl<char,std::char_traits<char>>);
                                    return PARSE_ARGUMENT_FAIL;
                                  }
                                  anon_unknown_4::PluginName
                                            (in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
                                  pmVar9 = std::
                                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)CONCAT17(uVar3,CONCAT16(uVar13,
                                                  in_stack_fffffffffffffb80)),
                                                  in_stack_fffffffffffffb78);
                                  std::__cxx11::string::~string(local_320);
                                  local_300 = pmVar9;
                                  uVar5 = std::__cxx11::string::empty();
                                  if ((uVar5 & 1) == 0) {
                                    std::__cxx11::string::append((char *)local_300);
                                  }
                                  std::__cxx11::string::append((string *)local_300);
                                }
                                else {
                                  local_2a8 = std::
                                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffffb87,
                                                             CONCAT16(in_stack_fffffffffffffb86,
                                                                      in_stack_fffffffffffffb80)),
                                                  in_stack_fffffffffffffb78);
                                  uVar5 = std::__cxx11::string::empty();
                                  if ((uVar5 & 1) == 0) {
                                    std::__cxx11::string::append((char *)local_2a8);
                                  }
                                  std::__cxx11::string::append((string *)local_2a8);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      poVar10 = std::operator<<((ostream *)&std::cerr,
                                "You seem to have passed an empty string as one of the arguments to "
                               );
      poVar10 = std::operator<<(poVar10,in_RDI);
      poVar10 = std::operator<<(poVar10,
                                ".  This is actually sort of hard to do.  Congrats.  Unfortunately it is not valid input so the program is going to die now."
                               );
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      return PARSE_ARGUMENT_FAIL;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb50._M_current,in_stack_fffffffffffffb48._M_current);
  }
  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}

Assistant:

CommandLineInterface::ParseArgumentStatus
CommandLineInterface::InterpretArgument(const std::string& name,
                                        const std::string& value) {
  if (name.empty()) {
    // Not a flag.  Just a filename.
    if (value.empty()) {
      std::cerr
          << "You seem to have passed an empty string as one of the "
             "arguments to "
          << executable_name_
          << ".  This is actually "
             "sort of hard to do.  Congrats.  Unfortunately it is not valid "
             "input so the program is going to die now."
          << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

#if defined(_WIN32)
    // On Windows, the shell (typically cmd.exe) does not expand wildcards in
    // file names (e.g. foo\*.proto), so we do it ourselves.
    switch (google::protobuf::io::win32::ExpandWildcards(
        value,
        [this](const string& path) { this->input_files_.push_back(path); })) {
      case google::protobuf::io::win32::ExpandWildcardsResult::kSuccess:
        break;
      case google::protobuf::io::win32::ExpandWildcardsResult::
          kErrorNoMatchingFile:
        // Path does not exist, is not a file, or it's longer than MAX_PATH and
        // long path handling is disabled.
        std::cerr << "Invalid file name pattern or missing input file \""
                  << value << "\"" << std::endl;
        return PARSE_ARGUMENT_FAIL;
      default:
        std::cerr << "Cannot convert path \"" << value
                  << "\" to or from Windows style" << std::endl;
        return PARSE_ARGUMENT_FAIL;
    }
#else   // not _WIN32
    // On other platforms than Windows (e.g. Linux, Mac OS) the shell (typically
    // Bash) expands wildcards.
    input_files_.push_back(value);
#endif  // _WIN32

  } else if (name == "-I" || name == "--proto_path") {
    // Java's -classpath (and some other languages) delimits path components
    // with colons.  Let's accept that syntax too just to make things more
    // intuitive.
    std::vector<std::string> parts = Split(
        value, CommandLineInterface::kPathSeparator,
        true);

    for (int i = 0; i < parts.size(); i++) {
      std::string virtual_path;
      std::string disk_path;

      std::string::size_type equals_pos = parts[i].find_first_of('=');
      if (equals_pos == std::string::npos) {
        virtual_path = "";
        disk_path = parts[i];
      } else {
        virtual_path = parts[i].substr(0, equals_pos);
        disk_path = parts[i].substr(equals_pos + 1);
      }

      if (disk_path.empty()) {
        std::cerr
            << "--proto_path passed empty directory name.  (Use \".\" for "
               "current directory.)"
            << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }

      // Make sure disk path exists, warn otherwise.
      if (access(disk_path.c_str(), F_OK) < 0) {
        // Try the original path; it may have just happened to have a '=' in it.
        if (access(parts[i].c_str(), F_OK) < 0) {
          std::cerr << disk_path << ": warning: directory does not exist."
                    << std::endl;
        } else {
          virtual_path = "";
          disk_path = parts[i];
        }
      }

      // Don't use make_pair as the old/default standard library on Solaris
      // doesn't support it without explicit template parameters, which are
      // incompatible with C++0x's make_pair.
      proto_path_.push_back(
          std::pair<std::string, std::string>(virtual_path, disk_path));
    }

  } else if (name == "--direct_dependencies") {
    if (direct_dependencies_explicitly_set_) {
      std::cerr << name
                << " may only be passed once. To specify multiple "
                   "direct dependencies, pass them all as a single "
                   "parameter separated by ':'."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    direct_dependencies_explicitly_set_ = true;
    std::vector<std::string> direct =
        Split(value, ":", true);
    GOOGLE_DCHECK(direct_dependencies_.empty());
    direct_dependencies_.insert(direct.begin(), direct.end());

  } else if (name == "--direct_dependencies_violation_msg") {
    direct_dependencies_violation_msg_ = value;

  } else if (name == "--descriptor_set_in") {
    if (!descriptor_set_in_names_.empty()) {
      std::cerr << name
                << " may only be passed once. To specify multiple "
                   "descriptor sets, pass them all as a single "
                   "parameter separated by '"
                << CommandLineInterface::kPathSeparator << "'." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!dependency_out_name_.empty()) {
      std::cerr << name << " cannot be used with --dependency_out."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    descriptor_set_in_names_ = Split(
        value, CommandLineInterface::kPathSeparator,
        true);

  } else if (name == "-o" || name == "--descriptor_set_out") {
    if (!descriptor_set_out_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (mode_ != MODE_COMPILE) {
      std::cerr
          << "Cannot use --encode or --decode and generate descriptors at the "
             "same time."
          << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    descriptor_set_out_name_ = value;

  } else if (name == "--dependency_out") {
    if (!dependency_out_name_.empty()) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (value.empty()) {
      std::cerr << name << " requires a non-empty value." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!descriptor_set_in_names_.empty()) {
      std::cerr << name << " cannot be used with --descriptor_set_in."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    dependency_out_name_ = value;

  } else if (name == "--include_imports") {
    if (imports_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    imports_in_descriptor_set_ = true;

  } else if (name == "--include_source_info") {
    if (source_info_in_descriptor_set_) {
      std::cerr << name << " may only be passed once." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    source_info_in_descriptor_set_ = true;

  } else if (name == "-h" || name == "--help") {
    PrintHelpText();
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.

  } else if (name == "--version") {
    if (!version_info_.empty()) {
      std::cout << version_info_ << std::endl;
    }
    std::cout << "libprotoc " << internal::VersionString(PROTOBUF_VERSION)
              << std::endl;
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.

  } else if (name == "--disallow_services") {
    disallow_services_ = true;

  } else if (name == "--encode" || name == "--decode" ||
             name == "--decode_raw") {
    if (mode_ != MODE_COMPILE) {
      std::cerr << "Only one of --encode and --decode can be specified."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!output_directives_.empty() || !descriptor_set_out_name_.empty()) {
      std::cerr << "Cannot use " << name
                << " and generate code or descriptors at the same time."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    mode_ = (name == "--encode") ? MODE_ENCODE : MODE_DECODE;

    if (value.empty() && name != "--decode_raw") {
      std::cerr << "Type name for " << name << " cannot be blank." << std::endl;
      if (name == "--decode") {
        std::cerr << "To decode an unknown message, use --decode_raw."
                  << std::endl;
      }
      return PARSE_ARGUMENT_FAIL;
    } else if (!value.empty() && name == "--decode_raw") {
      std::cerr << "--decode_raw does not take a parameter." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    codec_type_ = value;

  } else if (name == "--error_format") {
    if (value == "gcc") {
      error_format_ = ERROR_FORMAT_GCC;
    } else if (value == "msvs") {
      error_format_ = ERROR_FORMAT_MSVS;
    } else {
      std::cerr << "Unknown error format: " << value << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

  } else if (name == "--plugin") {
    if (plugin_prefix_.empty()) {
      std::cerr << "This compiler does not support plugins." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }

    std::string plugin_name;
    std::string path;

    std::string::size_type equals_pos = value.find_first_of('=');
    if (equals_pos == std::string::npos) {
      // Use the basename of the file.
      std::string::size_type slash_pos = value.find_last_of('/');
      if (slash_pos == std::string::npos) {
        plugin_name = value;
      } else {
        plugin_name = value.substr(slash_pos + 1);
      }
      path = value;
    } else {
      plugin_name = value.substr(0, equals_pos);
      path = value.substr(equals_pos + 1);
    }

    plugins_[plugin_name] = path;

  } else if (name == "--print_free_field_numbers") {
    if (mode_ != MODE_COMPILE) {
      std::cerr << "Cannot use " << name
                << " and use --encode, --decode or print "
                << "other info at the same time." << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    if (!output_directives_.empty() || !descriptor_set_out_name_.empty()) {
      std::cerr << "Cannot use " << name
                << " and generate code or descriptors at the same time."
                << std::endl;
      return PARSE_ARGUMENT_FAIL;
    }
    mode_ = MODE_PRINT;
    print_mode_ = PRINT_FREE_FIELDS;
  } else {
    // Some other flag.  Look it up in the generators list.
    const GeneratorInfo* generator_info =
        FindOrNull(generators_by_flag_name_, name);
    if (generator_info == NULL &&
        (plugin_prefix_.empty() || !HasSuffixString(name, "_out"))) {
      // Check if it's a generator option flag.
      generator_info = FindOrNull(generators_by_option_name_, name);
      if (generator_info != NULL) {
        std::string* parameters =
            &generator_parameters_[generator_info->flag_name];
        if (!parameters->empty()) {
          parameters->append(",");
        }
        parameters->append(value);
      } else if (HasPrefixString(name, "--") && HasSuffixString(name, "_opt")) {
        std::string* parameters =
            &plugin_parameters_[PluginName(plugin_prefix_, name)];
        if (!parameters->empty()) {
          parameters->append(",");
        }
        parameters->append(value);
      } else {
        std::cerr << "Unknown flag: " << name << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }
    } else {
      // It's an output flag.  Add it to the output directives.
      if (mode_ != MODE_COMPILE) {
        std::cerr << "Cannot use --encode, --decode or print .proto info and "
                     "generate code at the same time."
                  << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }

      OutputDirective directive;
      directive.name = name;
      if (generator_info == NULL) {
        directive.generator = NULL;
      } else {
        directive.generator = generator_info->generator;
      }

      // Split value at ':' to separate the generator parameter from the
      // filename.  However, avoid doing this if the colon is part of a valid
      // Windows-style absolute path.
      std::string::size_type colon_pos = value.find_first_of(':');
      if (colon_pos == std::string::npos || IsWindowsAbsolutePath(value)) {
        directive.output_location = value;
      } else {
        directive.parameter = value.substr(0, colon_pos);
        directive.output_location = value.substr(colon_pos + 1);
      }

      output_directives_.push_back(directive);
    }
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}